

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O2

void xe::parseTestCaseResultFromData
               (TestResultParser *parser,TestCaseResult *result,TestCaseResultData *data)

{
  string *psVar1;
  pointer puVar2;
  pointer puVar3;
  Error *pEVar4;
  deUint8 *bytes;
  allocator<char> local_49;
  string local_48;
  
  std::__cxx11::string::assign((char *)result);
  (result->super_TestCaseResultHeader).caseType = TESTCASETYPE_SELF_VALIDATE;
  (result->super_TestCaseResultHeader).statusCode = data->m_statusCode;
  psVar1 = &(result->super_TestCaseResultHeader).statusDetails;
  std::__cxx11::string::assign((char *)psVar1);
  if (*(int *)&(data->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
      *(int *)&(data->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start < 1) {
    if ((result->super_TestCaseResultHeader).statusCode != TESTSTATUSCODE_LAST) goto LAB_00112402;
    (result->super_TestCaseResultHeader).statusCode = TESTSTATUSCODE_TERMINATED;
  }
  else {
    TestResultParser::init(parser,(EVP_PKEY_CTX *)result);
    puVar2 = (data->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (data->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bytes = (deUint8 *)0x0;
    if (puVar2 != puVar3) {
      bytes = puVar2;
    }
    TestResultParser::parse(parser,bytes,(int)puVar3 - (int)puVar2);
    if ((result->super_TestCaseResultHeader).statusCode != TESTSTATUSCODE_LAST) goto LAB_00112402;
    (result->super_TestCaseResultHeader).statusCode = TESTSTATUSCODE_INTERNAL_ERROR;
  }
  std::__cxx11::string::assign((char *)psVar1);
LAB_00112402:
  if ((result->super_TestCaseResultHeader).casePath._M_string_length == 0) {
    pEVar4 = (Error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Empty test case path in result",&local_49);
    Error::Error(pEVar4,&local_48);
    __cxa_throw(pEVar4,&Error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((result->super_TestCaseResultHeader).caseType != TESTCASETYPE_LAST) {
    return;
  }
  pEVar4 = (Error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Invalid test case type in result",&local_49);
  Error::Error(pEVar4,&local_48);
  __cxa_throw(pEVar4,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parseTestCaseResultFromData (TestResultParser* parser, TestCaseResult* result, const TestCaseResultData& data)
{
	DE_ASSERT(result->resultItems.getNumItems() == 0);

	// Initialize status codes etc. from data.
	result->casePath		= data.getTestCasePath();
	result->caseType		= TESTCASETYPE_SELF_VALIDATE;
	result->statusCode		= data.getStatusCode();
	result->statusDetails	= data.getStatusDetails();

	if (data.getDataSize() > 0)
	{
		parser->init(result);

		const TestResultParser::ParseResult parseResult = parser->parse(data.getData(), data.getDataSize());

		if (result->statusCode == TESTSTATUSCODE_LAST)
		{
			result->statusCode = TESTSTATUSCODE_INTERNAL_ERROR;

			if (parseResult == TestResultParser::PARSERESULT_ERROR)
				result->statusDetails = "Test case result parsing failed";
			else if (parseResult != TestResultParser::PARSERESULT_COMPLETE)
				result->statusDetails = "Incomplete test case result";
			else
				result->statusDetails = "Test case result is missing <Result> item";
		}
	}
	else if (result->statusCode == TESTSTATUSCODE_LAST)
	{
		result->statusCode		= TESTSTATUSCODE_TERMINATED;
		result->statusDetails	= "Empty test case result";
	}

	if (result->casePath.empty())
		throw Error("Empty test case path in result");

	if (result->caseType == TESTCASETYPE_LAST)
		throw Error("Invalid test case type in result");

	DE_ASSERT(result->statusCode != TESTSTATUSCODE_LAST);
}